

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O2

void QSqlDatabasePrivate::removeDatabase(QString *name)

{
  char cVar1;
  bool bVar2;
  Type *pTVar3;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_> *this
  ;
  long in_FS_OFFSET;
  QSqlDatabase QStack_48;
  QWriteLocker local_40;
  undefined4 uStack_38;
  undefined8 uStack_34;
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
          *)name;
  cVar1 = QCoreApplication::instanceExists();
  if (cVar1 == '\0') {
    lcSqlDb();
    if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_40.q_val._0_4_ = 2;
      local_40.q_val._4_4_ = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      local_2c = 0;
      local_28 = lcSqlDb::category.name;
      QMessageLogger::warning((char *)&local_40,"QSqlDatabase requires a QCoreApplication");
    }
  }
  else {
    pTVar3 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
             ::operator()(this);
    local_40.q_val._0_4_ = SUB84(pTVar3,0);
    local_40.q_val._4_4_ = (undefined4)((ulong)pTVar3 >> 0x20);
    QWriteLocker::relock(&local_40);
    bVar2 = QHash<QString,_QSqlDatabase>::contains(&pTVar3->connections,name);
    if (bVar2) {
      QHash<QString,_QSqlDatabase>::takeImpl<QString>
                ((QHash<QString,_QSqlDatabase> *)&QStack_48,(QString *)&pTVar3->connections);
      invalidateDb(&QStack_48,name,true);
      QSqlDatabase::~QSqlDatabase(&QStack_48);
    }
    QWriteLocker::unlock(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlDatabasePrivate::removeDatabase(const QString &name)
{
    CHECK_QCOREAPPLICATION
    QtSqlGlobals *sqlGlobals = s_sqlGlobals();
    QWriteLocker locker(&sqlGlobals->lock);

    if (!sqlGlobals->connections.contains(name))
        return;

    invalidateDb(sqlGlobals->connections.take(name), name);
}